

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall CVmObjTable::enable_gc(CVmObjTable *this,int enable)

{
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  int old_enable;
  
  uVar1 = (uint)(*(byte *)(in_RDI + 0x78) & 1);
  *(byte *)(in_RDI + 0x78) = *(byte *)(in_RDI + 0x78) & 0xfe | (byte)in_ESI & 1;
  if ((uVar1 == 0) && (in_ESI != 0)) {
    alloc_check_gc((CVmObjTable *)((ulong)in_ESI << 0x20),(int)((ulong)in_RDI >> 0x20));
  }
  return uVar1;
}

Assistant:

int CVmObjTable::enable_gc(VMG_ int enable)
{
    /* remember the old status for returning */
    int old_enable = gc_enabled_;

    /* set the new status */
    gc_enabled_ = enable;

    /* 
     *   if we're enabling GC after it was previously disabled, check to
     *   see if we should perform a GC pass now (but don't count this as a
     *   separate allocation) 
     */
    if (!old_enable && enable)
        alloc_check_gc(vmg_ FALSE);

    /* return the previous status */
    return old_enable;
}